

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall libtorrent::aux::torrent::read_piece(torrent *this,piece_index_t piece)

{
  uint uVar1;
  session_interface *psVar2;
  long lVar3;
  peer_connection *ppVar4;
  element_type *this_00;
  shared_count sVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  generic_error_category *cat;
  undefined4 extraout_var;
  char *p;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  ulong uVar13;
  uint uVar14;
  piece_index_t piece_local;
  error_code local_d8;
  peer_request r;
  shared_ptr<libtorrent::aux::torrent::read_piece_struct> rp;
  shared_array<char> buf;
  __shared_ptr<libtorrent::aux::torrent::read_piece_struct,_(__gnu_cxx::_Lock_policy)2> local_78;
  shared_ptr<libtorrent::aux::torrent> self;
  _Any_data local_58;
  code *local_48;
  __uniq_ptr_impl<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
  _Stack_40;
  
  local_d8.failed_ = false;
  local_d8.cat_ =
       &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  piece_local.m_val = piece.m_val;
  if ((((this->super_torrent_hot_members).field_0x4b & 4) == 0) && ((this->field_0x5e0 & 4) == 0)) {
    if ((((this->super_torrent_hot_members).m_torrent_file.
          super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_files)
        .m_piece_length < 1) {
      cat = (generic_error_category *)libtorrent_category();
      local_d8.val_ = 0x6d;
      iVar9 = 0x6d;
    }
    else {
      bVar8 = has_piece_passed(this,piece);
      if (bVar8) goto LAB_002d1039;
      cat = (generic_error_category *)libtorrent_category();
      local_d8.val_ = 0x8d;
      iVar9 = 0x8d;
    }
  }
  else {
    local_d8.val_ = 0x7d;
    cat = &boost::system::detail::cat_holder<void>::generic_category_instance;
    iVar9 = 0x7d;
  }
  local_d8.failed_ = boost::system::detail::failed_impl(iVar9,&cat->super_error_category);
  local_d8.cat_ = &cat->super_error_category;
  if (local_d8.failed_) {
    iVar9 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [5])();
    get_handle((torrent *)&buf);
    alert_manager::
    emplace_alert<libtorrent::read_piece_alert,libtorrent::torrent_handle,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const&,boost::system::error_code&>
              ((alert_manager *)CONCAT44(extraout_var,iVar9),(torrent_handle *)&buf,&piece_local,
               &local_d8);
    ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
              ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&buf.pn);
    return;
  }
LAB_002d1039:
  iVar9 = file_storage::piece_size
                    (&((this->super_torrent_hot_members).m_torrent_file.
                       super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_files,piece);
  uVar1 = (((this->super_torrent_hot_members).m_torrent_file.
            super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          m_files).m_piece_length;
  uVar14 = 0x4000;
  if (uVar1 < 0x4000) {
    uVar14 = uVar1;
  }
  if ((int)uVar1 < 1) {
    uVar14 = 0x4000;
  }
  lVar3 = (long)(int)(iVar9 + uVar14 + -1);
  uVar13 = lVar3 / (long)(int)uVar14;
  iVar10 = (int)uVar13;
  if (iVar10 == 0) {
    buf.px = (char *)0x0;
    buf.pn.pi_ = (sp_counted_base *)0x0;
    psVar2 = (this->super_torrent_hot_members).m_ses;
    iVar9 = (*(psVar2->super_session_logger)._vptr_session_logger[5])
                      (psVar2,(ulong)uVar14,lVar3 % (long)(int)uVar14 & 0xffffffff);
    get_handle((torrent *)&rp);
    self.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
    alert_manager::
    emplace_alert<libtorrent::read_piece_alert,libtorrent::torrent_handle,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const&,boost::shared_array<char>&,int>
              ((alert_manager *)CONCAT44(extraout_var_02,iVar9),(torrent_handle *)&rp,&piece_local,
               &buf,(int *)&self);
    ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
              ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
               &rp.
                super___shared_ptr<libtorrent::aux::torrent::read_piece_struct,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    boost::detail::shared_count::~shared_count(&buf.pn);
  }
  else {
    ::std::make_shared<libtorrent::aux::torrent::read_piece_struct>();
    this_00 = rp.
              super___shared_ptr<libtorrent::aux::torrent::read_piece_struct,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    p = (char *)operator_new__((long)iVar9,(nothrow_t *)&::std::nothrow);
    boost::shared_array<char>::reset<char>(&this_00->piece_data,p);
    if (((rp.
          super___shared_ptr<libtorrent::aux::torrent::read_piece_struct,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr)->piece_data).px == (char *)0x0) {
      iVar9 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[5])();
      get_handle((torrent *)&buf);
      self.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
           0xc;
      self.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_1_ =
           boost::system::detail::failed_impl
                     (0xc,&boost::system::detail::cat_holder<void>::generic_category_instance.
                           super_error_category);
      self.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              &boost::system::detail::cat_holder<void>::generic_category_instance;
      alert_manager::
      emplace_alert<libtorrent::read_piece_alert,libtorrent::torrent_handle,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const&,boost::system::error_code>
                ((alert_manager *)CONCAT44(extraout_var_03,iVar9),(torrent_handle *)&buf,
                 &piece_local,(error_code *)&self);
      ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&buf.pn);
    }
    else {
      (rp.
       super___shared_ptr<libtorrent::aux::torrent::read_piece_struct,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr)->blocks_left = iVar10;
      (rp.
       super___shared_ptr<libtorrent::aux::torrent::read_piece_struct,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr)->fail = false;
      iVar11 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                 _vptr_session_logger[0x2e])();
      iVar11 = session_settings::get_int
                         ((session_settings *)CONCAT44(extraout_var_00,iVar11),0x4025);
      r.piece = piece_local;
      r.start = 0;
      ::std::__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<libtorrent::aux::torrent,void>
                ((__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2> *)&self,
                 (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)
                 &this->super_enable_shared_from_this<libtorrent::aux::torrent>);
      iVar12 = 0;
      uVar13 = uVar13 & 0xffffffff;
      if (iVar10 < 1) {
        uVar13 = 0;
      }
      for (; (int)uVar13 != 0; uVar13 = (ulong)((int)uVar13 - 1)) {
        uVar1 = (((this->super_torrent_hot_members).m_torrent_file.
                  super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                m_files).m_piece_length;
        r.length = 0x4000;
        if (uVar1 < 0x4000) {
          r.length = uVar1;
        }
        if ((int)uVar1 < 1) {
          r.length = 0x4000;
        }
        if (iVar9 - iVar12 <= r.length) {
          r.length = iVar9 - iVar12;
        }
        iVar12 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                   _vptr_session_logger[4])();
        uVar1 = (this->m_storage).m_idx.m_val;
        ::std::__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)&buf,
                   &self.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>);
        iVar10 = r.length;
        ppVar4 = (peer_connection *)CONCAT44(r.start,r.piece.m_val);
        ::std::__shared_ptr<libtorrent::aux::torrent::read_piece_struct,_(__gnu_cxx::_Lock_policy)2>
        ::__shared_ptr(&local_78,
                       &rp.
                        super___shared_ptr<libtorrent::aux::torrent::read_piece_struct,_(__gnu_cxx::_Lock_policy)2>
                      );
        local_48 = (code *)0x0;
        _Stack_40._M_t.
        super__Tuple_impl<0UL,_libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>
        .super__Head_base<0UL,_libtorrent::aux::peer_list_*,_false>._M_head_impl =
             (tuple<libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>)
             (_Tuple_impl<0UL,_libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>
              )0x0;
        local_58._M_unused._M_object = (pointer)0x0;
        local_58._8_8_ = (pointer)0x0;
        local_58._M_unused._M_object = operator_new(0x30);
        sVar5 = buf.pn;
        buf.pn.pi_ = (sp_counted_base *)0x0;
        *(char **)local_58._M_unused._0_8_ = buf.px;
        *(sp_counted_base **)((long)local_58._M_unused._0_8_ + 8) = sVar5.pi_;
        buf.px = (char *)0x0;
        *(int *)((long)local_58._M_unused._0_8_ + 0x18) = iVar10;
        *(peer_connection **)((long)local_58._M_unused._0_8_ + 0x10) = ppVar4;
        uVar6 = local_78._M_refcount._M_pi._0_4_;
        uVar7 = local_78._M_refcount._M_pi._4_4_;
        local_78._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        *(undefined4 *)((long)local_58._M_unused._0_8_ + 0x20) = local_78._M_ptr._0_4_;
        *(undefined4 *)((long)local_58._M_unused._0_8_ + 0x24) = local_78._M_ptr._4_4_;
        *(undefined4 *)((long)local_58._M_unused._0_8_ + 0x28) = uVar6;
        *(undefined4 *)((long)local_58._M_unused._0_8_ + 0x2c) = uVar7;
        local_78._M_ptr = (element_type *)0x0;
        _Stack_40._M_t.
        super__Tuple_impl<0UL,_libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>
        .super__Head_base<0UL,_libtorrent::aux::peer_list_*,_false>._M_head_impl =
             (tuple<libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>)
             ::std::
             _Function_handler<void_(libtorrent::disk_buffer_holder,_const_libtorrent::storage_error_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:779:7)>
             ::_M_invoke;
        local_48 = ::std::
                   _Function_handler<void_(libtorrent::disk_buffer_holder,_const_libtorrent::storage_error_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:779:7)>
                   ::_M_manager;
        (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar12) + 0x10))
                  ((long *)CONCAT44(extraout_var_01,iVar12),uVar1,&r,&local_58,(iVar11 == 2) << 4);
        ::std::_Function_base::~_Function_base((_Function_base *)&local_58);
        read_piece(libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>)::$_0
        ::~__0((__0 *)&buf);
        uVar1 = (((this->super_torrent_hot_members).m_torrent_file.
                  super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                m_files).m_piece_length;
        uVar14 = 0x4000;
        if (uVar1 < 0x4000) {
          uVar14 = uVar1;
        }
        if ((int)uVar1 < 1) {
          uVar14 = 0x4000;
        }
        iVar12 = uVar14 + r.start;
        r.start = iVar12;
      }
      (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger[0x1f]
      )();
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&self.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&rp.
                super___shared_ptr<libtorrent::aux::torrent::read_piece_struct,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  }
  return;
}

Assistant:

void torrent::read_piece(piece_index_t const piece)
	{
		error_code ec;
		if (m_abort || m_deleted)
		{
			ec.assign(boost::system::errc::operation_canceled, generic_category());
		}
		else if (!valid_metadata())
		{
			ec.assign(errors::no_metadata, libtorrent_category());
		}
		else if (!has_piece_passed(piece))
		{
			ec.assign(errors::invalid_piece_index, libtorrent_category());
		}

		if (ec)
		{
			m_ses.alerts().emplace_alert<read_piece_alert>(get_handle(), piece, ec);
			return;
		}

		const int piece_size = m_torrent_file->piece_size(piece);
		const int blocks_in_piece = (piece_size + block_size() - 1) / block_size();

		TORRENT_ASSERT(blocks_in_piece > 0);
		TORRENT_ASSERT(piece_size > 0);

		if (blocks_in_piece == 0)
		{
			// this shouldn't actually happen
			boost::shared_array<char> buf;
			m_ses.alerts().emplace_alert<read_piece_alert>(
				get_handle(), piece, buf, 0);
			return;
		}

		std::shared_ptr<read_piece_struct> rp = std::make_shared<read_piece_struct>();
		rp->piece_data.reset(new (std::nothrow) char[std::size_t(piece_size)]);
		if (!rp->piece_data)
		{
			m_ses.alerts().emplace_alert<read_piece_alert>(
				get_handle(), piece, error_code(boost::system::errc::not_enough_memory, generic_category()));
			return;
		}
		rp->blocks_left = blocks_in_piece;
		rp->fail = false;

		disk_job_flags_t flags{};
		auto const read_mode = settings().get_int(settings_pack::disk_io_read_mode);
		if (read_mode == settings_pack::disable_os_cache)
			flags |= disk_interface::volatile_read;

		peer_request r;
		r.piece = piece;
		r.start = 0;
		auto self = shared_from_this();
		for (int i = 0; i < blocks_in_piece; ++i, r.start += block_size())
		{
			r.length = std::min(piece_size - r.start, block_size());
			m_ses.disk_thread().async_read(m_storage, r
				, [self, r, rp](disk_buffer_holder block, storage_error const& se) mutable
				{ self->on_disk_read_complete(std::move(block), se, r, rp); }
				, flags);
		}
		m_ses.deferred_submit_jobs();
	}